

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::write_content_with_provider
          (Server *this,Stream *strm,Request *req,Response *res,string *boundary,
          string *content_type)

{
  Request *pRVar1;
  bool bVar2;
  size_type sVar3;
  ssize_t sVar4;
  function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
  local_d0;
  function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
  local_b0;
  size_t local_90;
  unsigned_long length;
  unsigned_long offset;
  pair<unsigned_long,_unsigned_long> offsets;
  function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
  local_60;
  string *local_40;
  string *content_type_local;
  string *boundary_local;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  Server *this_local;
  
  local_40 = content_type;
  content_type_local = boundary;
  boundary_local = &res->version;
  res_local = (Response *)req;
  req_local = (Request *)strm;
  strm_local = (Stream *)this;
  if (res->content_length == 0) {
    std::
    function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
    ::function(&local_d0,&res->content_provider);
    sVar4 = detail::write_content_chunked(strm,&local_d0);
    std::
    function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
    ::~function(&local_d0);
    if (sVar4 < 0) {
      return false;
    }
  }
  else {
    bVar2 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::empty
                      (&req->ranges);
    pRVar1 = req_local;
    if (bVar2) {
      std::
      function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
      ::function(&local_60,
                 (function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
                  *)(boundary_local + 4));
      sVar4 = detail::write_content
                        ((Stream *)pRVar1,&local_60,0,
                         *(size_t *)((long)&boundary_local[3].field_2 + 8));
      std::
      function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
      ::~function(&local_60);
      if (sVar4 < 0) {
        return false;
      }
    }
    else {
      sVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                        ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                         ((long)&res_local[1].body.field_2 + 8));
      if (sVar3 == 1) {
        _offset = detail::get_range_offset_and_length
                            ((Request *)res_local,*(size_t *)((long)&boundary_local[3].field_2 + 8),
                             0);
        pRVar1 = req_local;
        length = offset;
        local_90 = offsets.first;
        std::
        function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
        ::function(&local_b0,
                   (function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
                    *)(boundary_local + 4));
        sVar4 = detail::write_content((Stream *)pRVar1,&local_b0,length,local_90);
        std::
        function<void_(unsigned_long,_unsigned_long,_std::function<void_(const_char_*,_unsigned_long)>,_std::function<void_()>)>
        ::~function(&local_b0);
        if (sVar4 < 0) {
          return false;
        }
      }
      else {
        bVar2 = detail::write_multipart_ranges_data
                          ((Stream *)req_local,(Request *)res_local,(Response *)boundary_local,
                           content_type_local,local_40);
        if (!bVar2) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

inline bool
Server::write_content_with_provider(Stream &strm, const Request &req,
                                    Response &res, const std::string &boundary,
                                    const std::string &content_type) {
  if (res.content_length) {
    if (req.ranges.empty()) {
      if (detail::write_content(strm, res.content_provider, 0,
                                res.content_length) < 0) {
        return false;
      }
    } else if (req.ranges.size() == 1) {
      auto offsets =
          detail::get_range_offset_and_length(req, res.content_length, 0);
      auto offset = offsets.first;
      auto length = offsets.second;
      if (detail::write_content(strm, res.content_provider, offset, length) <
          0) {
        return false;
      }
    } else {
      if (!detail::write_multipart_ranges_data(strm, req, res, boundary,
                                               content_type)) {
        return false;
      }
    }
  } else {
    if (detail::write_content_chunked(strm, res.content_provider) < 0) {
      return false;
    }
  }
  return true;
}